

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

ptls_openssl_signature_scheme_t * ptls_openssl_lookup_signature_schemes(EVP_PKEY *key)

{
  int iVar1;
  ec_key_st *key_00;
  EC_GROUP *group;
  ptls_openssl_signature_scheme_t *ppVar2;
  
  iVar1 = EVP_PKEY_get_id();
  if (iVar1 == 0x43f) {
    ppVar2 = ed25519_signature_schemes;
  }
  else if (iVar1 == 0x198) {
    key_00 = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)key);
    group = EC_KEY_get0_group(key_00);
    iVar1 = EC_GROUP_get_curve_name(group);
    if (iVar1 == 0x2cc) {
      ppVar2 = secp521r1_signature_schemes;
    }
    else if (iVar1 == 0x2cb) {
      ppVar2 = secp384r1_signature_schemes;
    }
    else if (iVar1 == 0x19f) {
      ppVar2 = secp256r1_signature_schemes;
    }
    else {
      ppVar2 = (ptls_openssl_signature_scheme_t *)0x0;
    }
    EC_KEY_free(key_00);
  }
  else if (iVar1 == 6) {
    ppVar2 = rsa_signature_schemes;
  }
  else {
    ppVar2 = (ptls_openssl_signature_scheme_t *)0x0;
  }
  return ppVar2;
}

Assistant:

const ptls_openssl_signature_scheme_t *ptls_openssl_lookup_signature_schemes(EVP_PKEY *key)
{
    const ptls_openssl_signature_scheme_t *schemes = NULL;

    switch (EVP_PKEY_id(key)) {
    case EVP_PKEY_RSA:
        schemes = rsa_signature_schemes;
        break;
    case EVP_PKEY_EC: {
        EC_KEY *eckey = EVP_PKEY_get1_EC_KEY(key);
        switch (EC_GROUP_get_curve_name(EC_KEY_get0_group(eckey))) {
        case NID_X9_62_prime256v1:
            schemes = secp256r1_signature_schemes;
            break;
#if PTLS_OPENSSL_HAVE_SECP384R1
        case NID_secp384r1:
            schemes = secp384r1_signature_schemes;
            break;
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
        case NID_secp521r1:
            schemes = secp521r1_signature_schemes;
            break;
#endif
        default:
            break;
        }
        EC_KEY_free(eckey);
    } break;
#if PTLS_OPENSSL_HAVE_ED25519
    case EVP_PKEY_ED25519:
        schemes = ed25519_signature_schemes;
        break;
#endif
    default:
        break;
    }

    return schemes;
}